

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buffer,int length,cJSON_bool format)

{
  long in_FS_OFFSET;
  cJSON_bool format_local;
  int length_local;
  char *buffer_local;
  cJSON *item_local;
  undefined1 local_50 [8];
  printbuffer p;
  
  p.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(local_50,0,0x40);
  if ((length < 0) || (buffer == (char *)0x0)) {
    item_local._4_4_ = 0;
  }
  else {
    p.buffer = (uchar *)(long)length;
    p.length = 0;
    p.depth._0_4_ = 1;
    p._32_8_ = global_hooks.allocate;
    p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
    p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    local_50 = (undefined1  [8])buffer;
    p.depth._4_4_ = format;
    item_local._4_4_ = print_value(item,(printbuffer *)local_50);
  }
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) == p.hooks.reallocate) {
    return item_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buffer, const int length, const cJSON_bool format)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((length < 0) || (buffer == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buffer;
    p.length = (size_t)length;
    p.offset = 0;
    p.noalloc = true;
    p.format = format;
    p.hooks = global_hooks;

    return print_value(item, &p);
}